

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

bool leveldb::ConsumeDecimalNumber(Slice *in,uint64_t *val)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  size_t sVar7;
  
  pbVar3 = (byte *)in->data_;
  sVar7 = in->size_;
  if (sVar7 == 0) {
    uVar6 = 0;
    pbVar5 = pbVar3;
  }
  else {
    pbVar1 = pbVar3 + sVar7;
    uVar6 = 0;
    pbVar4 = pbVar3;
    do {
      bVar2 = *pbVar4;
      pbVar5 = pbVar4;
      if ((byte)(bVar2 - 0x3a) < 0xf6) break;
      if ((0x1999999999999999 < uVar6) || (uVar6 == 0x1999999999999999 && 0x35 < bVar2)) {
        return false;
      }
      uVar6 = (ulong)(bVar2 & 0xf) + uVar6 * 10;
      pbVar4 = pbVar4 + 1;
      sVar7 = sVar7 - 1;
      pbVar5 = pbVar1;
    } while (sVar7 != 0);
  }
  *val = uVar6;
  uVar6 = (long)pbVar5 - (long)pbVar3;
  if (uVar6 <= in->size_) {
    in->data_ = (char *)(pbVar3 + uVar6);
    in->size_ = in->size_ - uVar6;
    return pbVar5 != pbVar3;
  }
  __assert_fail("n <= size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/include/leveldb/slice.h"
                ,0x45,"void leveldb::Slice::remove_prefix(size_t)");
}

Assistant:

bool ConsumeDecimalNumber(Slice* in, uint64_t* val) {
  // Constants that will be optimized away.
  constexpr const uint64_t kMaxUint64 = std::numeric_limits<uint64_t>::max();
  constexpr const char kLastDigitOfMaxUint64 =
      '0' + static_cast<char>(kMaxUint64 % 10);

  uint64_t value = 0;

  // reinterpret_cast-ing from char* to uint8_t* to avoid signedness.
  const uint8_t* start = reinterpret_cast<const uint8_t*>(in->data());

  const uint8_t* end = start + in->size();
  const uint8_t* current = start;
  for (; current != end; ++current) {
    const uint8_t ch = *current;
    if (ch < '0' || ch > '9') break;

    // Overflow check.
    // kMaxUint64 / 10 is also constant and will be optimized away.
    if (value > kMaxUint64 / 10 ||
        (value == kMaxUint64 / 10 && ch > kLastDigitOfMaxUint64)) {
      return false;
    }

    value = (value * 10) + (ch - '0');
  }

  *val = value;
  const size_t digits_consumed = current - start;
  in->remove_prefix(digits_consumed);
  return digits_consumed != 0;
}